

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

Value __thiscall
MiniScript::Parser::ParseMap(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  int tempNum;
  ParseState *this_00;
  Type TVar1;
  long *plVar2;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar3;
  byte in_R8B;
  Value VVar4;
  code *local_2b0;
  Value local_270;
  Value local_260;
  Value local_250;
  TACLine local_240;
  undefined1 local_1dd;
  int local_1dc;
  String local_1d8;
  Lexer local_1c8;
  Token local_1c0;
  Lexer local_1a0;
  undefined1 local_198 [8];
  Value value;
  Token local_168;
  Lexer local_148;
  undefined1 local_140 [8];
  Value key;
  Type local_110;
  Lexer local_f0;
  Token local_e8;
  Token local_c8;
  undefined1 local_a8 [8];
  ValueDict map;
  Lexer local_60;
  Token local_58;
  code *local_38;
  offset_in_Parser_to_subr nextLevel;
  byte local_22;
  byte local_21;
  bool statementStart_local;
  Lexer *pLStack_20;
  bool asLval_local;
  Lexer *tokens_local;
  Parser *this_local;
  Value *result;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_22 = in_R8B & 1;
  local_38 = ParseList;
  nextLevel = 0;
  local_21 = statementStart;
  pLStack_20 = this_01;
  tokens_local = tokens;
  this_local = this;
  Lexer::Peek(&local_58,this_01);
  Token::~Token(&local_58);
  if (local_58.type == LCurly) {
    Lexer::Dequeue((Token *)&map.isTemp,this_01);
    Token::~Token((Token *)&map.isTemp);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_a8)
    ;
    Lexer::Peek(&local_c8,this_01);
    Token::~Token(&local_c8);
    if (local_c8.type == RCurly) {
      Lexer::Dequeue(&local_e8,this_01);
      Token::~Token(&local_e8);
    }
    else {
      do {
        Lexer::Lexer(&local_f0,this_01);
        AllowLineBreak(&local_f0);
        Lexer::~Lexer(&local_f0);
        Lexer::Peek((Token *)&stack0xfffffffffffffef0,this_01);
        TVar1 = local_110;
        Token::~Token((Token *)&stack0xfffffffffffffef0);
        if (TVar1 == RCurly) {
          Lexer::Dequeue((Token *)&key.data,this_01);
          Token::~Token((Token *)&key.data);
          break;
        }
        Lexer::Lexer(&local_148,this_01);
        ParseExpr((Parser *)local_140,tokens,SUB81(&local_148,0),false);
        Lexer::~Lexer(&local_148);
        Lexer::Lexer((Lexer *)&stack0xfffffffffffffe90,this_01);
        String::String((String *)&stack0xfffffffffffffe80);
        RequireToken(&local_168,(Parser *)tokens,(Lexer *)&stack0xfffffffffffffe90,Colon,
                     (String *)&stack0xfffffffffffffe80);
        Token::~Token(&local_168);
        String::~String((String *)&stack0xfffffffffffffe80);
        Lexer::~Lexer((Lexer *)&stack0xfffffffffffffe90);
        Lexer::Lexer((Lexer *)&value.data,this_01);
        AllowLineBreak((Lexer *)&value.data);
        Lexer::~Lexer((Lexer *)&value.data);
        Lexer::Lexer(&local_1a0,this_01);
        ParseExpr((Parser *)local_198,tokens,SUB81(&local_1a0,0),false);
        Lexer::~Lexer(&local_1a0);
        Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                  ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                   local_a8,(Value *)local_140,(Value *)local_198);
        Lexer::Lexer(&local_1c8,this_01);
        String::String(&local_1d8);
        RequireEitherToken(&local_1c0,(Parser *)tokens,&local_1c8,Comma,RCurly,&local_1d8);
        TVar1 = local_1c0.type;
        Token::~Token(&local_1c0);
        String::~String(&local_1d8);
        Lexer::~Lexer(&local_1c8);
        if (TVar1 == RCurly) {
          local_1dc = 3;
        }
        else {
          local_1dc = 0;
        }
        Value::~Value((Value *)local_198);
        Value::~Value((Value *)local_140);
      } while (local_1dc == 0);
    }
    local_1dd = 0;
    tempNum = *(int *)&((tokens[6].ls)->pending).ls;
    *(int *)&((tokens[6].ls)->pending).ls = tempNum + 1;
    Value::Temp((Value *)this,tempNum);
    this_00 = (ParseState *)tokens[6].ls;
    Value::Value(&local_250,(Value *)this);
    Value::Value(&local_260,(ValueDict *)local_a8);
    Value::Value(&local_270,(Value *)Value::null);
    TACLine::TACLine(&local_240,&local_250,CopyA,&local_260,&local_270);
    ParseState::Add(this_00,&local_240);
    TACLine::~TACLine(&local_240);
    Value::~Value(&local_270);
    Value::~Value(&local_260);
    Value::~Value(&local_250);
    local_1dc = 1;
    local_1dd = 1;
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_a8)
    ;
    aVar3 = extraout_RDX_00;
  }
  else {
    plVar2 = (long *)((long)&tokens->ls + nextLevel);
    if (((ulong)local_38 & 1) == 0) {
      local_2b0 = local_38;
    }
    else {
      local_2b0 = *(code **)(local_38 + *plVar2 + -1);
    }
    Lexer::Lexer(&local_60,this_01);
    (*local_2b0)(this,plVar2,&local_60,local_21 & 1,local_22 & 1);
    Lexer::~Lexer(&local_60);
    aVar3 = extraout_RDX;
  }
  VVar4.data.number = aVar3.number;
  VVar4._0_8_ = this;
  return VVar4;
}

Assistant:

Value Parser::ParseMap(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseList;
		if (tokens.Peek().type != Token::Type::LCurly) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();
		// NOTE: we must be sure this map gets created at runtime, not here at parse time.
		// Since it is a mutable object, we need to return a different one each time
		// this code executes (in a loop, function, etc.).  So, we use Op.CopyA below!
		ValueDict map;
		if (tokens.Peek().type == Token::Type::RCurly) {
			tokens.Dequeue();
		} else while (true) {
			AllowLineBreak(tokens); // allow a line break after a comma or open brace
			
			// Allow the map to close with a } on its own line.
			if (tokens.Peek().type == Token::Type::RCurly) {
				tokens.Dequeue();
				break;
			}

			Value key = ParseExpr(tokens);
			RequireToken(tokens, Token::Type::Colon);
			AllowLineBreak(tokens); // allow a line break after a colon
			Value value = ParseExpr(tokens);

			map.SetValue(key, value);

			if (RequireEitherToken(tokens, Token::Type::Comma, Token::Type::RCurly).type == Token::Type::RCurly) break;
		}
		Value result = Value::Temp(output->nextTempNum++);
		output->Add(TACLine(result, TACLine::Op::CopyA, map));
		return result;
	}